

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManComputeSlacks(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_01;
  int *piVar3;
  int iVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  long lVar6;
  
  iVar1 = Gia_ManLevelNum(p);
  __ptr = Gia_ManReverseLevel(p);
  iVar2 = p->nObjs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar4 = iVar2;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
    uVar5 = extraout_RDX;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
    uVar5 = extraout_RDX_00;
  }
  p_01->pArray = piVar3;
  iVar2 = p->nObjs;
  if ((0 < iVar2) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar6 = 1;
    do {
      p_00 = p->vLevels;
      Vec_IntFillExtra(p_00,(int)lVar6,(int)uVar5);
      if (((long)p_00->nSize <= lVar6 + -1) || ((long)__ptr->nSize <= lVar6 + -1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_01,iVar1 - (p_00->pArray[lVar6 + -1] + __ptr->pArray[lVar6 + -1]));
      iVar2 = p->nObjs;
    } while ((lVar6 < iVar2) &&
            (lVar6 = lVar6 + 1, uVar5 = extraout_RDX_01, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if (p_01->nSize == iVar2) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    return p_01;
  }
  __assert_fail("Vec_IntSize(vSlacks) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                ,0x29f,"Vec_Int_t *Gia_ManComputeSlacks(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManComputeSlacks( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    Vec_Int_t * vLevelR = Gia_ManReverseLevel( p );
    Vec_Int_t * vSlacks = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vSlacks, nLevels - Gia_ObjLevelId(p, i) - Vec_IntEntry(vLevelR, i) );
    assert( Vec_IntSize(vSlacks) == Gia_ManObjNum(p) );
    Vec_IntFree( vLevelR );
    return vSlacks;
}